

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

nifti_1_header * nt_read_header(nt_opts *opts,char *fname,int *swapped,int check)

{
  int iVar1;
  nifti_1_header *pnVar2;
  
  if ((opts != (nt_opts *)0x0) && (fname != (char *)0x0)) {
    iVar1 = strncmp(fname,"MAKE_IM",7);
    if (iVar1 != 0) {
      if (1 < g_debug) {
        fprintf(_stderr,"-d calling nifti_read_header(%s,...)\n",fname);
      }
      pnVar2 = nifti_read_header(fname,swapped,check);
      return pnVar2;
    }
    if (1 < g_debug) {
      nt_read_header_cold_1();
    }
    pnVar2 = nifti_make_new_header(opts->new_dim,opts->new_datatype);
    return pnVar2;
  }
  fprintf(_stderr,"** nt_read_header: bad params (%p,%p)\n",opts,fname);
  return (nifti_1_header *)0x0;
}

Assistant:

nifti_1_header * nt_read_header(nt_opts * opts, char * fname, int * swapped,
                                int check)
{
    /* swapped is not necessary */
    if( !opts || !fname ) {
        fprintf(stderr,"** nt_read_header: bad params (%p,%p)\n",
                (void *)opts,(void *)fname);
        return NULL;
    }

    /* if the user does not want an empty image, do normal image_read */
    if( strncmp(fname,NT_MAKE_IM_NAME,strlen(NT_MAKE_IM_NAME)) ) {
        if(g_debug > 1)
            fprintf(stderr,"-d calling nifti_read_header(%s,...)\n", fname);
        return nifti_read_header(fname, swapped, check);
    }

    /* so generate an emtpy image */
    if(g_debug > 1) {
        fprintf(stderr,"+d NT_RH: generating EMPTY IMAGE from %s...\n",fname);
        if(g_debug > 2) {
            printf("   new_dim[8] = ");
            disp_raw_data(opts->new_dim, DT_INT32, 8, ' ', 1);
            printf("   new_datatype = %d\n", opts->new_datatype);
            fflush(stdout);
        }
    }

    /* return creation of new header */
    return nifti_make_new_header(opts->new_dim, opts->new_datatype);
}